

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::constant_op_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstantOp *cop)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint32_t id;
  BaseType BVar3;
  uint32_t *puVar4;
  uint *puVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  SPIRType *pSVar9;
  long *plVar10;
  SPIRType *pSVar11;
  runtime_error *prVar12;
  char *pcVar13;
  size_type *psVar14;
  bool skip_cast_if_equal_type;
  ulong uVar15;
  uint32_t uVar16;
  _Alloc_hider _Var17;
  char (*in_R9) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde8;
  BaseType input_type;
  string local_200;
  string cast_op1;
  string right_arg;
  string op;
  string left_arg;
  uint *local_160;
  uint local_148 [8];
  bool *local_128;
  size_t local_120;
  bool local_110 [24];
  TypedID<(spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  TypedID<(spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pSVar9 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (cop->basetype).id);
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  uVar8 = 0x81;
  if ((this->options).es != false) {
    uVar8 = 299;
  }
  if ((this->options).version <= uVar8) {
    iVar2 = *(int *)&(cop->super_IVariant).field_0xc;
    uVar8 = iVar2 - 0x6d;
    if (((uVar8 < 0x40) && ((0x8000040012000019U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) ||
       ((uVar8 = iVar2 - 0xae, uVar8 < 0x15 && ((0x100015U >> (uVar8 & 0x1f) & 1) != 0)))) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Unsigned integers are not supported on legacy targets.","");
      ::std::runtime_error::runtime_error(prVar12,(string *)&left_arg);
      *(undefined ***)prVar12 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  iVar2 = *(int *)&(cop->super_IVariant).field_0xc;
  if (iVar2 < 0x7e) {
    if (0x70 < iVar2) {
      if (2 < iVar2 - 0x71U) goto switchD_001e70cd_caseD_7f;
      type_to_glsl_constructor_abi_cxx11_(&left_arg,this,pSVar9);
      ::std::__cxx11::string::operator=((string *)&op,(string *)&left_arg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)left_arg._M_dataplus._M_p != &left_arg.field_2) {
        operator_delete(left_arg._M_dataplus._M_p);
      }
      goto LAB_001e7bb7;
    }
    if (iVar2 != 0x4f) {
      if (iVar2 != 0x51) {
        if (iVar2 == 0x52) {
          prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
          left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&left_arg,"OpCompositeInsert spec constant op is not supported.","");
          ::std::runtime_error::runtime_error(prVar12,(string *)&left_arg);
          *(undefined ***)prVar12 = &PTR__runtime_error_003d7e38;
          __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        goto switchD_001e70cd_caseD_7f;
      }
      puVar4 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      access_chain_internal_abi_cxx11_
                (__return_storage_ptr__,this,*puVar4,puVar4 + 1,
                 (int)(cop->arguments).super_VectorView<unsigned_int>.buffer_size - 1,1,
                 (AccessChainMeta *)0x0);
      goto LAB_001e7a49;
    }
    type_to_glsl_constructor_abi_cxx11_(__return_storage_ptr__,this,pSVar9);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pSVar9 = Compiler::expression_type
                       (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
    uVar8 = pSVar9->vecsize;
    to_enclosed_expression_abi_cxx11_
              (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    to_enclosed_expression_abi_cxx11_
              (&right_arg,this,(cop->arguments).super_VectorView<unsigned_int>.ptr[1],true);
    if (2 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size) {
      paVar1 = &cast_op1.field_2;
      uVar15 = 2;
      do {
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
        if ((cop->arguments).super_VectorView<unsigned_int>.ptr[uVar15] < uVar8) {
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_200,left_arg._M_dataplus._M_p,
                     left_arg._M_dataplus._M_p +
                     CONCAT44(left_arg._M_string_length._4_4_,(undefined4)left_arg._M_string_length)
                    );
          ::std::__cxx11::string::append((char *)&local_200);
          plVar10 = (long *)::std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_200,local_200._M_string_length,0,'\x01');
          psVar14 = (size_type *)(plVar10 + 2);
          if ((size_type *)*plVar10 == psVar14) {
            cast_op1.field_2._M_allocated_capacity = *psVar14;
            cast_op1.field_2._8_8_ = plVar10[3];
            cast_op1._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            cast_op1.field_2._M_allocated_capacity = *psVar14;
            cast_op1._M_dataplus._M_p = (pointer)*plVar10;
          }
          cast_op1._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)cast_op1._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cast_op1._M_dataplus._M_p != paVar1) {
            operator_delete(cast_op1._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
LAB_001e743f:
            operator_delete(local_200._M_dataplus._M_p);
          }
        }
        else {
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_200,right_arg._M_dataplus._M_p,
                     right_arg._M_dataplus._M_p + right_arg._M_string_length);
          ::std::__cxx11::string::append((char *)&local_200);
          plVar10 = (long *)::std::__cxx11::string::_M_replace_aux
                                      ((ulong)&local_200,local_200._M_string_length,0,'\x01');
          psVar14 = (size_type *)(plVar10 + 2);
          if ((size_type *)*plVar10 == psVar14) {
            cast_op1.field_2._M_allocated_capacity = *psVar14;
            cast_op1.field_2._8_8_ = plVar10[3];
            cast_op1._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            cast_op1.field_2._M_allocated_capacity = *psVar14;
            cast_op1._M_dataplus._M_p = (pointer)*plVar10;
          }
          cast_op1._M_string_length = plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)cast_op1._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cast_op1._M_dataplus._M_p != paVar1) {
            operator_delete(cast_op1._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) goto LAB_001e743f;
        }
        uVar15 = uVar15 + 1;
        if (uVar15 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      } while (uVar15 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
      operator_delete(right_arg._M_dataplus._M_p);
    }
    _Var17._M_p = left_arg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001e7a49;
    goto LAB_001e7a44;
  }
  switch(iVar2) {
  case 0x7e:
    pcVar13 = "-";
    goto LAB_001e7bc8;
  default:
switchD_001e70cd_caseD_7f:
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&left_arg,"Unimplemented spec constant op.","");
    ::std::runtime_error::runtime_error(prVar12,(string *)&left_arg);
    *(undefined ***)prVar12 = &PTR__runtime_error_003d7e38;
    __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0x80:
    pcVar13 = "+";
    break;
  case 0x82:
    pcVar13 = "-";
    break;
  case 0x84:
    pcVar13 = "*";
    break;
  case 0x86:
  case 0x87:
    pcVar13 = "/";
    break;
  case 0x89:
  case 0x8b:
    pcVar13 = "%";
    break;
  case 0x8a:
    puVar4 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    uVar16 = *puVar4;
    id = puVar4[1];
    to_enclosed_expression_abi_cxx11_(&left_arg,this,uVar16,true);
    to_enclosed_expression_abi_cxx11_(&right_arg,this,id,true);
    to_enclosed_expression_abi_cxx11_(&cast_op1,this,uVar16,true);
    to_enclosed_expression_abi_cxx11_(&local_200,this,id,true);
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34cf71,
               (char (*) [4])&right_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f3b5,
               (char (*) [4])0x35f5ef,(char (*) [2])&cast_op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34d3be,
               (char (*) [4])&local_200,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,
               (char (*) [2])in_stack_fffffffffffffde8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cast_op1._M_dataplus._M_p != &cast_op1.field_2) {
      operator_delete(cast_op1._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
      operator_delete(right_arg._M_dataplus._M_p);
    }
    _Var17._M_p = left_arg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001e7a49;
    goto LAB_001e7a44;
  case 0xa4:
  case 0xaa:
    pcVar13 = "==";
    break;
  case 0xa5:
  case 0xab:
    pcVar13 = "!=";
    break;
  case 0xa6:
    pcVar13 = "||";
    break;
  case 0xa7:
    pcVar13 = "&&";
    break;
  case 0xa8:
    pcVar13 = "!";
    goto LAB_001e7bc8;
  case 0xa9:
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 3) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar12,(string *)&left_arg);
      *(undefined ***)prVar12 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar5 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    in_R9 = (char (*) [2])(ulong)*puVar5;
    bVar7 = to_trivial_mix_op(this,pSVar9,&op,puVar5[2],puVar5[1],*puVar5);
    if (!bVar7) {
      puVar4 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      to_ternary_expression_abi_cxx11_
                (__return_storage_ptr__,this,pSVar9,*puVar4,puVar4[1],puVar4[2]);
      goto LAB_001e7a49;
    }
LAB_001e7bb7:
    bVar7 = false;
    bVar6 = false;
    goto LAB_001e7612;
  case 0xac:
  case 0xad:
    pcVar13 = ">";
    break;
  case 0xae:
  case 0xaf:
    pcVar13 = ">=";
    break;
  case 0xb0:
  case 0xb1:
    pcVar13 = "<";
    break;
  case 0xb2:
  case 0xb3:
    pcVar13 = "<=";
    break;
  case 0xc2:
  case 0xc3:
    pcVar13 = ">>";
    break;
  case 0xc4:
    pcVar13 = "<<";
    break;
  case 0xc5:
    pcVar13 = "|";
    break;
  case 0xc6:
    pcVar13 = "^";
    break;
  case 199:
    pcVar13 = "&";
    break;
  case 200:
    pcVar13 = "~";
LAB_001e7bc8:
    bVar6 = false;
    ::std::__cxx11::string::_M_replace((ulong)&op,0,(char *)0x0,(ulong)pcVar13);
    bVar7 = true;
    goto LAB_001e7612;
  }
  bVar7 = false;
  ::std::__cxx11::string::_M_replace((ulong)&op,0,(char *)0x0,(ulong)pcVar13);
  bVar6 = true;
LAB_001e7612:
  if ((bVar7 || bVar6) || (uVar16 = 0, *(int *)&(cop->super_IVariant).field_0xc - 0x71U < 2)) {
    pSVar11 = Compiler::expression_type
                        (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr)
    ;
    uVar16 = pSVar11->width;
  }
  iVar2 = *(int *)&(cop->super_IVariant).field_0xc;
  skip_cast_if_equal_type = true;
  if (((0x2b < iVar2 - 0x80U) || ((0xc0000000015U >> ((ulong)(iVar2 - 0x80U) & 0x3f) & 1) == 0)) &&
     (3 < iVar2 - 0xc4U)) {
    skip_cast_if_equal_type = false;
  }
  if (iVar2 < 0xaa) {
    if (iVar2 < 0x86) {
      if (iVar2 == 0x71) {
switchD_001e76c7_caseD_86:
        input_type = to_unsigned_basetype(uVar16);
        goto LAB_001e76e8;
      }
      if ((iVar2 == 0x72) || (iVar2 == 0x7e)) goto switchD_001e76c7_caseD_87;
    }
    else {
      switch(iVar2) {
      case 0x86:
      case 0x89:
        goto switchD_001e76c7_caseD_86;
      case 0x87:
      case 0x8b:
switchD_001e76c7_caseD_87:
        input_type = to_signed_basetype(uVar16);
        goto LAB_001e76e8;
      }
    }
switchD_001e76c7_caseD_88:
    input_type = *(BaseType *)&(pSVar9->super_IVariant).field_0xc;
  }
  else {
    uVar8 = iVar2 - 0xaa;
    if (0x19 < uVar8) goto switchD_001e76c7_caseD_88;
    if ((0x1000154U >> (uVar8 & 0x1f) & 1) != 0) goto switchD_001e76c7_caseD_86;
    if ((0x20002a8U >> (uVar8 & 0x1f) & 1) != 0) goto switchD_001e76c7_caseD_87;
    if ((3U >> (uVar8 & 0x1f) & 1) == 0) goto switchD_001e76c7_caseD_88;
    input_type = to_signed_basetype(uVar16);
  }
LAB_001e76e8:
  if (bVar6) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 2) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar12,(string *)&left_arg);
      *(undefined ***)prVar12 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    right_arg._M_string_length = 0;
    right_arg.field_2._M_local_buf[0] = '\0';
    cast_op1._M_string_length = 0;
    cast_op1.field_2._M_allocated_capacity =
         cast_op1.field_2._M_allocated_capacity & 0xffffffffffffff00;
    puVar4 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    cast_op1._M_dataplus._M_p = (pointer)&cast_op1.field_2;
    right_arg._M_dataplus._M_p = (pointer)&right_arg.field_2;
    binary_op_bitcast_helper
              ((SPIRType *)&left_arg,this,&right_arg,&cast_op1,&input_type,*puVar4,puVar4[1],
               skip_cast_if_equal_type);
    BVar3 = *(BaseType *)&(pSVar9->super_IVariant).field_0xc;
    if (BVar3 == Boolean || BVar3 == input_type) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x35f5ef,(char (*) [2])&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348c37,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348c37,
                 (char (*) [2])&cast_op1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,
                 (char (*) [2])in_stack_fffffffffffffde8);
    }
    else {
      left_arg._M_string_length._4_4_ = input_type;
      (*(this->super_Compiler)._vptr_Compiler[0x38])(__return_storage_ptr__,this,pSVar9);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_200,(spirv_cross *)&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348c37,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x348c37,
                 (char (*) [2])&cast_op1,in_stack_fffffffffffffde8);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_200._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    left_arg._M_dataplus._M_p = (pointer)&PTR__SPIRType_003d8230;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_e0) {
      free(local_f8);
    }
    local_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    if (local_160 != local_148) {
      free(local_160);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cast_op1._M_dataplus._M_p != &cast_op1.field_2) {
      operator_delete(cast_op1._M_dataplus._M_p);
    }
    _Var17._M_p = right_arg._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p == &right_arg.field_2) goto LAB_001e7a49;
  }
  else if (bVar7) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar12,(string *)&left_arg);
      *(undefined ***)prVar12 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bitcast_glsl_abi_cxx11_
              (&left_arg,this,pSVar9,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
    join<char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x35f5ef,(char (*) [2])&op,&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,in_R9);
    _Var17 = left_arg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001e7a49;
  }
  else if (*(int *)&(cop->super_IVariant).field_0xc - 0x71U < 2) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar12,(string *)&left_arg);
      *(undefined ***)prVar12 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar11 = Compiler::expression_type
                        (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr)
    ;
    BVar3 = input_type;
    if ((pSVar11->width < pSVar9->width) &&
       (input_type != *(BaseType *)&(pSVar11->super_IVariant).field_0xc)) {
      SPIRType::SPIRType((SPIRType *)&left_arg,pSVar11);
      left_arg._M_string_length._4_4_ = BVar3;
      bitcast_glsl_abi_cxx11_
                (&right_arg,this,(SPIRType *)&left_arg,
                 *(cop->arguments).super_VectorView<unsigned_int>.ptr);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f5ef,
                 (char (*) [2])&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,in_R9
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
        operator_delete(right_arg._M_dataplus._M_p);
      }
      left_arg._M_dataplus._M_p = (pointer)&PTR__SPIRType_003d8230;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      local_b8 = 0;
      if (local_c0 != local_a8) {
        free(local_c0);
      }
      local_f0 = 0;
      if (local_f8 != local_e0) {
        free(local_f8);
      }
      local_120 = 0;
      if (local_128 != local_110) {
        free(local_128);
      }
      if (local_160 != local_148) {
        free(local_160);
      }
      goto LAB_001e7a49;
    }
    to_expression_abi_cxx11_
              (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f5ef,
               (char (*) [2])&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,in_R9);
    _Var17 = left_arg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001e7a49;
  }
  else {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      left_arg._M_dataplus._M_p = (pointer)&left_arg.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.","");
      ::std::runtime_error::runtime_error(prVar12,(string *)&left_arg);
      *(undefined ***)prVar12 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    to_expression_abi_cxx11_
              (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f5ef,
               (char (*) [2])&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,in_R9);
    _Var17 = left_arg._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)left_arg._M_dataplus._M_p == &left_arg.field_2) goto LAB_001e7a49;
  }
LAB_001e7a44:
  operator_delete(_Var17._M_p);
LAB_001e7a49:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p != &op.field_2) {
    operator_delete(op._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_op_expression(const SPIRConstantOp &cop)
{
	auto &type = get<SPIRType>(cop.basetype);
	bool binary = false;
	bool unary = false;
	string op;

	if (is_legacy() && is_unsigned_opcode(cop.opcode))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	// TODO: Find a clean way to reuse emit_instruction.
	switch (cop.opcode)
	{
	case OpSConvert:
	case OpUConvert:
	case OpFConvert:
		op = type_to_glsl_constructor(type);
		break;

#define GLSL_BOP(opname, x) \
	case Op##opname:        \
		binary = true;      \
		op = x;             \
		break

#define GLSL_UOP(opname, x) \
	case Op##opname:        \
		unary = true;       \
		op = x;             \
		break

		GLSL_UOP(SNegate, "-");
		GLSL_UOP(Not, "~");
		GLSL_BOP(IAdd, "+");
		GLSL_BOP(ISub, "-");
		GLSL_BOP(IMul, "*");
		GLSL_BOP(SDiv, "/");
		GLSL_BOP(UDiv, "/");
		GLSL_BOP(UMod, "%");
		GLSL_BOP(SMod, "%");
		GLSL_BOP(ShiftRightLogical, ">>");
		GLSL_BOP(ShiftRightArithmetic, ">>");
		GLSL_BOP(ShiftLeftLogical, "<<");
		GLSL_BOP(BitwiseOr, "|");
		GLSL_BOP(BitwiseXor, "^");
		GLSL_BOP(BitwiseAnd, "&");
		GLSL_BOP(LogicalOr, "||");
		GLSL_BOP(LogicalAnd, "&&");
		GLSL_UOP(LogicalNot, "!");
		GLSL_BOP(LogicalEqual, "==");
		GLSL_BOP(LogicalNotEqual, "!=");
		GLSL_BOP(IEqual, "==");
		GLSL_BOP(INotEqual, "!=");
		GLSL_BOP(ULessThan, "<");
		GLSL_BOP(SLessThan, "<");
		GLSL_BOP(ULessThanEqual, "<=");
		GLSL_BOP(SLessThanEqual, "<=");
		GLSL_BOP(UGreaterThan, ">");
		GLSL_BOP(SGreaterThan, ">");
		GLSL_BOP(UGreaterThanEqual, ">=");
		GLSL_BOP(SGreaterThanEqual, ">=");

	case OpSRem:
	{
		uint32_t op0 = cop.arguments[0];
		uint32_t op1 = cop.arguments[1];
		return join(to_enclosed_expression(op0), " - ", to_enclosed_expression(op1), " * ", "(",
		                 to_enclosed_expression(op0), " / ", to_enclosed_expression(op1), ")");
	}

	case OpSelect:
	{
		if (cop.arguments.size() < 3)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// This one is pretty annoying. It's triggered from
		// uint(bool), int(bool) from spec constants.
		// In order to preserve its compile-time constness in Vulkan GLSL,
		// we need to reduce the OpSelect expression back to this simplified model.
		// If we cannot, fail.
		if (to_trivial_mix_op(type, op, cop.arguments[2], cop.arguments[1], cop.arguments[0]))
		{
			// Implement as a simple cast down below.
		}
		else
		{
			// Implement a ternary and pray the compiler understands it :)
			return to_ternary_expression(type, cop.arguments[0], cop.arguments[1], cop.arguments[2]);
		}
		break;
	}

	case OpVectorShuffle:
	{
		string expr = type_to_glsl_constructor(type);
		expr += "(";

		uint32_t left_components = expression_type(cop.arguments[0]).vecsize;
		string left_arg = to_enclosed_expression(cop.arguments[0]);
		string right_arg = to_enclosed_expression(cop.arguments[1]);

		for (uint32_t i = 2; i < uint32_t(cop.arguments.size()); i++)
		{
			uint32_t index = cop.arguments[i];
			if (index >= left_components)
				expr += right_arg + "." + "xyzw"[index - left_components];
			else
				expr += left_arg + "." + "xyzw"[index];

			if (i + 1 < uint32_t(cop.arguments.size()))
				expr += ", ";
		}

		expr += ")";
		return expr;
	}

	case OpCompositeExtract:
	{
		auto expr = access_chain_internal(cop.arguments[0], &cop.arguments[1], uint32_t(cop.arguments.size() - 1),
		                                  ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, nullptr);
		return expr;
	}

	case OpCompositeInsert:
		SPIRV_CROSS_THROW("OpCompositeInsert spec constant op is not supported.");

	default:
		// Some opcodes are unimplemented here, these are currently not possible to test from glslang.
		SPIRV_CROSS_THROW("Unimplemented spec constant op.");
	}

	uint32_t bit_width = 0;
	if (unary || binary || cop.opcode == OpSConvert || cop.opcode == OpUConvert)
		bit_width = expression_type(cop.arguments[0]).width;

	SPIRType::BaseType input_type;
	bool skip_cast_if_equal_type = opcode_is_sign_invariant(cop.opcode);

	switch (cop.opcode)
	{
	case OpIEqual:
	case OpINotEqual:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpSMod:
	case OpSDiv:
	case OpShiftRightArithmetic:
	case OpSConvert:
	case OpSNegate:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
	case OpUMod:
	case OpUDiv:
	case OpShiftRightLogical:
	case OpUConvert:
		input_type = to_unsigned_basetype(bit_width);
		break;

	default:
		input_type = type.basetype;
		break;
	}

#undef GLSL_BOP
#undef GLSL_UOP
	if (binary)
	{
		if (cop.arguments.size() < 2)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		string cast_op0;
		string cast_op1;
		auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, cop.arguments[0],
		                                              cop.arguments[1], skip_cast_if_equal_type);

		if (type.basetype != input_type && type.basetype != SPIRType::Boolean)
		{
			expected_type.basetype = input_type;
			auto expr = bitcast_glsl_op(type, expected_type);
			expr += '(';
			expr += join(cast_op0, " ", op, " ", cast_op1);
			expr += ')';
			return expr;
		}
		else
			return join("(", cast_op0, " ", op, " ", cast_op1, ")");
	}
	else if (unary)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// Auto-bitcast to result type as needed.
		// Works around various casting scenarios in glslang as there is no OpBitcast for specialization constants.
		return join("(", op, bitcast_glsl(type, cop.arguments[0]), ")");
	}
	else if (cop.opcode == OpSConvert || cop.opcode == OpUConvert)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		auto &arg_type = expression_type(cop.arguments[0]);
		if (arg_type.width < type.width && input_type != arg_type.basetype)
		{
			auto expected = arg_type;
			expected.basetype = input_type;
			return join(op, "(", bitcast_glsl(expected, cop.arguments[0]), ")");
		}
		else
			return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
	else
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");
		return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
}